

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_TakeLastOpt2_Test::TestBody(TApp_TakeLastOpt2_Test *this)

{
  Option *this_00;
  char *message;
  long lVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_c8;
  AssertHelper local_c0;
  AssertionResult gtest_ar;
  string local_98 [32];
  string str;
  string local_58;
  string local_38;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_38,"--str",(allocator *)&gtest_ar);
  message = "";
  std::__cxx11::string::string((string *)&local_58,"",(allocator *)&sStack_c8);
  this_00 = CLI::App::
            add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                      (&(this->super_TApp).app,&local_38,&str,&local_58);
  CLI::OptionBase<CLI::Option>::take_last(&this_00->super_OptionBase<CLI::Option>);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&gtest_ar,"--str=one",(allocator *)&sStack_c8);
  std::__cxx11::string::string(local_98,"--str=two",(allocator *)&local_c0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,&gtest_ar,&str);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"str","\"two\"",&str,(char (*) [4])0x1583e1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&sStack_c8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0xf2,message);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&sStack_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&sStack_c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

TEST_F(TApp, TakeLastOpt2) {

    std::string str;
    app.add_option("--str", str)->take_last();

    args = {"--str=one", "--str=two"};

    run();

    EXPECT_EQ(str, "two");
}